

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::DeleteDestination(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  uint16_t portbase;
  AddressType AVar1;
  in6_addr ip;
  int status;
  undefined1 local_60 [8];
  RTPIPv6Destination dest;
  RTPIPv6Address *address;
  RTPAddress *addr_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv6Address) {
      dest.rtcpaddr._20_8_ = addr;
      ip = RTPIPv6Address::GetIP((RTPIPv6Address *)addr);
      portbase = RTPIPv6Address::GetPort((RTPIPv6Address *)dest.rtcpaddr._20_8_);
      RTPIPv6Destination::RTPIPv6Destination((RTPIPv6Destination *)local_60,ip,portbase);
      this_local._4_4_ =
           RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
           ::DeleteElement(&this->destinations,(RTPIPv6Destination *)local_60);
    }
    else {
      this_local._4_4_ = -0x6c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	RTPIPv6Address &address = (RTPIPv6Address &)addr;	
	RTPIPv6Destination dest(address.GetIP(),address.GetPort());
	int status = destinations.DeleteElement(dest);
	
	MAINMUTEX_UNLOCK
	return status;
}